

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_test.cpp
# Opt level: O2

void __thiscall skip_this_test::test_method(skip_this_test *this)

{
  long *plVar1;
  undefined8 uVar2;
  size_t sVar3;
  shared_count sStack_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  char **local_28;
  
  plVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  uVar2 = boost::unit_test::framework::current_test_case();
  local_50 = "This test is ignored";
  sVar3 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    ("This test is ignored");
  local_48 = "This test is ignored" + sVar3;
  (**(code **)(*plVar1 + 0x28))(plVar1,uVar2,&local_50);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x7a);
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_28 = &local_80;
  local_80 = "true";
  local_78 = "";
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_00115618;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_98);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(skip_this_test)
{
    boost::unit_test::unit_test_log.test_unit_skipped(
        boost::unit_test_framework::framework::current_test_case()
#if BOOST_VERSION >= 105900
      , "This test is ignored"
#endif                                                      // BOOST_VERSION >= 105900
      );
    BOOST_CHECK(true);
}